

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O0

char ** apprun_file_read_lines(char *filename)

{
  FILE *__stream;
  char **array;
  FILE *fp;
  char **result;
  char *filename_local;
  
  fp = (FILE *)0x0;
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    array = apprun_read_lines((FILE *)__stream);
    fp = (FILE *)apprun_adjust_string_array_size(array);
    fclose(__stream);
  }
  return (char **)fp;
}

Assistant:

char **apprun_file_read_lines(const char *filename) {
    char **result = NULL;

    FILE *fp = fopen(filename, "r");
    if (fp) {
        result = apprun_read_lines(fp);
        result = apprun_adjust_string_array_size(result);
        fclose(fp);
    }

    return result;
}